

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O0

void quicly_cc_reno_on_lost
               (quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t lost_pn,uint64_t next_pn
               ,int64_t now,uint32_t max_udp_payload_size)

{
  int64_t now_local;
  uint64_t next_pn_local;
  uint64_t lost_pn_local;
  uint32_t bytes_local;
  quicly_loss_t *loss_local;
  quicly_cc_t *cc_local;
  
  if (cc->recovery_end <= lost_pn) {
    cc->recovery_end = next_pn;
    cc->num_loss_episodes = cc->num_loss_episodes + 1;
    if (cc->cwnd_exiting_slow_start == 0) {
      cc->cwnd_exiting_slow_start = cc->cwnd;
    }
    cc->cwnd = (uint32_t)(long)((double)cc->cwnd * 0.7);
    if (cc->cwnd < max_udp_payload_size << 1) {
      cc->cwnd = max_udp_payload_size << 1;
    }
    cc->ssthresh = cc->cwnd;
    if (cc->cwnd < cc->cwnd_minimum) {
      cc->cwnd_minimum = cc->cwnd;
    }
  }
  return;
}

Assistant:

void quicly_cc_reno_on_lost(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t lost_pn, uint64_t next_pn,
                            int64_t now, uint32_t max_udp_payload_size)
{
    /* Nothing to do if loss is in recovery window. */
    if (lost_pn < cc->recovery_end)
        return;
    cc->recovery_end = next_pn;

    ++cc->num_loss_episodes;
    if (cc->cwnd_exiting_slow_start == 0)
        cc->cwnd_exiting_slow_start = cc->cwnd;

    /* Reduce congestion window. */
    cc->cwnd *= QUICLY_RENO_BETA;
    if (cc->cwnd < QUICLY_MIN_CWND * max_udp_payload_size)
        cc->cwnd = QUICLY_MIN_CWND * max_udp_payload_size;
    cc->ssthresh = cc->cwnd;

    if (cc->cwnd_minimum > cc->cwnd)
        cc->cwnd_minimum = cc->cwnd;
}